

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O0

BVIndex __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
GetFreeIndexForPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
                   Page *page,size_t bytes)

{
  uint l;
  BVIndex BVar1;
  BVIndex index;
  uint length;
  size_t bytes_local;
  Page *page_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  l = GetChunkSizeForBytes(this,bytes);
  BVar1 = BVUnitT<unsigned_long>::FirstStringOfOnes(&page->freeBitVector,l);
  return BVar1;
}

Assistant:

inline BVIndex GetFreeIndexForPage(Page* page, DECLSPEC_GUARD_OVERFLOW size_t bytes)
    {
        unsigned int length = GetChunkSizeForBytes(bytes);
        BVIndex index = page->freeBitVector.FirstStringOfOnes(length);

        return index;
    }